

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::TexImage3DParamsCase::createTexture(TexImage3DParamsCase *this)

{
  int iVar1;
  int iVar2;
  int depth;
  deUint32 internalFormat;
  int slicePitch_00;
  int iVar3;
  deInt32 rowPitch_00;
  TransferFormat TVar4;
  reference pvVar5;
  int local_128;
  int local_124;
  PixelBufferAccess local_118;
  Vector<float,_4> local_ec;
  Vector<float,_4> local_dc;
  undefined1 local_cc [8];
  Vec4 colorB;
  Vector<float,_4> local_ac;
  undefined1 local_9c [8];
  Vec4 colorA;
  Vec4 cBias;
  Vec4 cScale;
  undefined1 local_60 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  deUint32 tex;
  int slicePitch;
  int imageHeight;
  int rowPitch;
  int rowLength;
  int pixelSize;
  deUint32 local_28;
  deUint32 dStack_24;
  TransferFormat transferFmt;
  TexImage3DParamsCase *this_local;
  
  TVar4 = glu::getTransferFormat((this->super_Texture3DSpecCase).m_texFormat);
  iVar3 = tcu::TextureFormat::getPixelSize(&(this->super_Texture3DSpecCase).m_texFormat);
  if (this->m_rowLength < 1) {
    local_124 = (this->super_Texture3DSpecCase).m_width;
  }
  else {
    local_124 = this->m_rowLength;
  }
  rowPitch_00 = deAlign32(local_124 * iVar3,this->m_alignment);
  if (this->m_imageHeight < 1) {
    local_128 = (this->super_Texture3DSpecCase).m_height;
  }
  else {
    local_128 = this->m_imageHeight;
  }
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = local_128 * rowPitch_00;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,
             (long)(iVar3 * this->m_skipPixels + rowPitch_00 * this->m_skipRows +
                   data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_ *
                   (this->m_skipImages + (this->super_Texture3DSpecCase).m_depth)));
  tcu::operator-((tcu *)(cBias.m_data + 2),&(this->super_Texture3DSpecCase).m_texFormatInfo.valueMax
                 ,&(this->super_Texture3DSpecCase).m_texFormatInfo.valueMin);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(colorA.m_data + 2),
             &(this->super_Texture3DSpecCase).m_texFormatInfo.valueMin);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(colorB.m_data + 2),1.0,0.0,0.0,1.0);
  tcu::operator*((tcu *)&local_ac,(Vector<float,_4> *)(colorB.m_data + 2),
                 (Vector<float,_4> *)(cBias.m_data + 2));
  tcu::operator+((tcu *)local_9c,&local_ac,(Vector<float,_4> *)(colorA.m_data + 2));
  tcu::Vector<float,_4>::Vector(&local_ec,0.0,1.0,0.0,1.0);
  tcu::operator*((tcu *)&local_dc,&local_ec,(Vector<float,_4> *)(cBias.m_data + 2));
  tcu::operator+((tcu *)local_cc,&local_dc,(Vector<float,_4> *)(colorA.m_data + 2));
  slicePitch_00 =
       data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_;
  iVar1 = (this->super_Texture3DSpecCase).m_width;
  iVar2 = (this->super_Texture3DSpecCase).m_height;
  depth = (this->super_Texture3DSpecCase).m_depth;
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,0);
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_118,&(this->super_Texture3DSpecCase).m_texFormat,iVar1,iVar2,depth,rowPitch_00,
             slicePitch_00,
             pvVar5 + (long)(this->m_skipPixels * iVar3) +
                      (long)(this->m_skipRows * rowPitch_00) +
                      (long)(this->m_skipImages *
                            data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_));
  tcu::fillWithGrid(&local_118,4,(Vec4 *)local_9c,(Vec4 *)local_cc);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_Texture3DSpecCase).super_TextureSpecCase.super_ContextWrapper,0x806e,
             this->m_imageHeight);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_Texture3DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xcf2,
             this->m_rowLength);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_Texture3DSpecCase).super_TextureSpecCase.super_ContextWrapper,0x806d,
             this->m_skipImages);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_Texture3DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xcf3,
             this->m_skipRows);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_Texture3DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xcf4,
             this->m_skipPixels);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_Texture3DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xcf5,
             this->m_alignment);
  sglr::ContextWrapper::glGenTextures
            (&(this->super_Texture3DSpecCase).super_TextureSpecCase.super_ContextWrapper,1,
             (deUint32 *)
             &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  sglr::ContextWrapper::glBindTexture
            (&(this->super_Texture3DSpecCase).super_TextureSpecCase.super_ContextWrapper,0x806f,
             (deUint32)
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  internalFormat = this->m_internalFormat;
  iVar3 = (this->super_Texture3DSpecCase).m_width;
  iVar1 = (this->super_Texture3DSpecCase).m_height;
  iVar2 = (this->super_Texture3DSpecCase).m_depth;
  local_28 = TVar4.format;
  dStack_24 = TVar4.dataType;
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,0);
  sglr::ContextWrapper::glTexImage3D
            (&(this->super_Texture3DSpecCase).super_TextureSpecCase.super_ContextWrapper,0x806f,0,
             internalFormat,iVar3,iVar1,iVar2,0,local_28,dStack_24,pvVar5);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
  return;
}

Assistant:

void createTexture (void)
	{
		glu::TransferFormat		transferFmt		= glu::getTransferFormat(m_texFormat);
		int						pixelSize		= m_texFormat.getPixelSize();
		int						rowLength		= m_rowLength > 0 ? m_rowLength : m_width;
		int						rowPitch		= deAlign32(rowLength*pixelSize, m_alignment);
		int						imageHeight		= m_imageHeight > 0 ? m_imageHeight : m_height;
		int						slicePitch		= imageHeight*rowPitch;
		deUint32				tex				= 0;
		vector<deUint8>			data;

		DE_ASSERT(m_numLevels == 1);

		// Fill data with grid.
		data.resize(pixelSize * m_skipPixels + rowPitch * m_skipRows + slicePitch * (m_skipImages + m_depth));
		{
			Vec4	cScale		= m_texFormatInfo.valueMax-m_texFormatInfo.valueMin;
			Vec4	cBias		= m_texFormatInfo.valueMin;
			Vec4	colorA		= Vec4(1.0f, 0.0f, 0.0f, 1.0f)*cScale + cBias;
			Vec4	colorB		= Vec4(0.0f, 1.0f, 0.0f, 1.0f)*cScale + cBias;

			tcu::fillWithGrid(tcu::PixelBufferAccess(m_texFormat, m_width, m_height, m_depth, rowPitch, slicePitch, &data[0] + m_skipImages*slicePitch + m_skipRows*rowPitch + m_skipPixels*pixelSize), 4, colorA, colorB);
		}

		glPixelStorei(GL_UNPACK_IMAGE_HEIGHT,	m_imageHeight);
		glPixelStorei(GL_UNPACK_ROW_LENGTH,		m_rowLength);
		glPixelStorei(GL_UNPACK_SKIP_IMAGES,	m_skipImages);
		glPixelStorei(GL_UNPACK_SKIP_ROWS,		m_skipRows);
		glPixelStorei(GL_UNPACK_SKIP_PIXELS,	m_skipPixels);
		glPixelStorei(GL_UNPACK_ALIGNMENT,		m_alignment);

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_3D, tex);
		glTexImage3D(GL_TEXTURE_3D, 0, m_internalFormat, m_width, m_height, m_depth, 0, transferFmt.format, transferFmt.dataType, &data[0]);
	}